

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O0

void __thiscall xercesc_4_0::AbstractDOMParser::reset(AbstractDOMParser *this)

{
  RefVectorOf<xercesc_4_0::DOMDocumentImpl> *this_00;
  AbstractDOMParser *this_local;
  
  if ((this->fDocument != (DOMDocumentImpl *)0x0) && ((this->fDocumentAdoptedByUser & 1U) == 0)) {
    if (this->fDocumentVector == (RefVectorOf<xercesc_4_0::DOMDocumentImpl> *)0x0) {
      this_00 = (RefVectorOf<xercesc_4_0::DOMDocumentImpl> *)
                XMemory::operator_new(0x30,this->fMemoryManager);
      RefVectorOf<xercesc_4_0::DOMDocumentImpl>::RefVectorOf(this_00,10,true,this->fMemoryManager);
      this->fDocumentVector = this_00;
    }
    BaseRefVectorOf<xercesc_4_0::DOMDocumentImpl>::addElement
              (&this->fDocumentVector->super_BaseRefVectorOf<xercesc_4_0::DOMDocumentImpl>,
               this->fDocument);
  }
  this->fDocument = (DOMDocumentImpl *)0x0;
  (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x1c])();
  this->fCurrentParent = (DOMNode *)0x0;
  this->fCurrentNode = (DOMNode *)0x0;
  this->fCurrentEntity = (DOMEntityImpl *)0x0;
  this->fWithinElement = false;
  this->fDocumentAdoptedByUser = false;
  XMLBuffer::reset(this->fInternalSubset);
  return;
}

Assistant:

void AbstractDOMParser::reset()
{
    // if fDocument exists already, store the old pointer in the vector for deletion later
    if (fDocument && !fDocumentAdoptedByUser) {
        if (!fDocumentVector) {
            // allocate the vector if not exists yet
            fDocumentVector  = new (fMemoryManager) RefVectorOf<DOMDocumentImpl>(10, true, fMemoryManager) ;
        }
        fDocumentVector->addElement(fDocument);
    }

    fDocument = 0;
    resetDocType();
    fCurrentParent   = 0;
    fCurrentNode     = 0;
    fCurrentEntity   = 0;
    fWithinElement   = false;
    fDocumentAdoptedByUser = false;
    fInternalSubset.reset();
}